

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

void __thiscall
VertexBuffer::VertexBuffer(VertexBuffer *this,uint32_t size,void *data,bool immutable)

{
  socklen_t __len;
  undefined7 in_register_00000009;
  sockaddr *__addr;
  uint32_t __fd;
  bool immutable_local;
  void *data_local;
  uint32_t size_local;
  VertexBuffer *this_local;
  
  __len = (socklen_t)CONCAT71(in_register_00000009,immutable);
  __fd = size;
  BufferLayout::BufferLayout(&this->m_layout);
  init_buffer(this);
  bind(this,__fd,__addr,__len);
  (*glad_glBufferData)(0x8892,(GLsizeiptr)size,data,0x88e4);
  return;
}

Assistant:

VertexBuffer::VertexBuffer(uint32_t size, const void* data, bool immutable)
{
    init_buffer();

#if OPENGL_VERSION >= 45
    if (immutable)
    {
        // Only dynamic for storage
        glNamedBufferStorage(m_id, size, data, GL_DYNAMIC_STORAGE_BIT);
    }
    else
        glNamedBufferData(m_id, size, data, GL_STATIC_DRAW);
#elif OPENGL_VERSION >= 44
    bind();

    if (immutable)
        glBufferStorage(GL_ARRAY_BUFFER, size, data, GL_DYNAMIC_STORAGE_BIT);
    else
        glBufferData(GL_ARRAY_BUFFER, size, data, GL_STATIC_DRAW);
#else
    bind();
    glBufferData(GL_ARRAY_BUFFER, size, data, GL_STATIC_DRAW);
#endif
}